

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  FILE *__stream;
  long lVar7;
  int iVar8;
  bool bVar9;
  
  lVar6 = gdImageCreate(100,100);
  if (lVar6 == 0) {
    fwrite("can\'t create image",0x12,1,_stderr);
  }
  else {
    __stream = fopen("anim.gif","wb");
    if (__stream != (FILE *)0x0) {
      gdImageColorAllocate(lVar6,0xff,0xff,0xff);
      gdImageGifAnimBegin(lVar6,__stream,1,0xffffffffffffffff);
      iVar8 = 0x14;
      lVar6 = 0;
      while (lVar7 = lVar6, bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
        lVar6 = gdImageCreate(100,100);
        iVar1 = rand();
        iVar2 = rand();
        iVar3 = rand();
        gdImageColorAllocate(lVar6,0xff,0xff,0xff);
        uVar4 = gdImageColorAllocate
                          (lVar6,(long)iVar1 % 0xff & 0xffffffff,(long)iVar2 % 0xff & 0xffffffff,
                           (long)iVar3 % 0xff & 0xffffffff);
        printf("(%i, %i, %i)\n",(long)iVar1 % 0xff & 0xffffffff,(long)iVar2 % 0xff & 0xffffffff,
               (long)iVar3 % 0xff & 0xffffffff);
        iVar1 = rand();
        iVar2 = rand();
        iVar3 = rand();
        iVar5 = rand();
        gdImageFilledRectangle
                  (lVar6,(long)iVar1 % 100 & 0xffffffff,(long)iVar2 % 100 & 0xffffffff,
                   (long)iVar3 % 100 & 0xffffffff,(long)iVar5 % 100 & 0xffffffff,uVar4);
        gdImageGifAnimAdd(lVar6,__stream,1,0,0,10,1);
        if (lVar7 != 0) {
          gdImageDestroy(lVar7);
        }
      }
      gdImageGifAnimEnd(__stream);
      fclose(__stream);
      return 0;
    }
    fprintf(_stderr,"can\'t create file %s","anim.gif");
  }
  return 1;
}

Assistant:

int main(void)
{
	int i;
	FILE * out;

	gdImagePtr im;
	gdImagePtr prev =NULL;
	int black;

	im = gdImageCreate(100, 100);
	if (!im) {
		fprintf(stderr, "can't create image");
		return 1;
	}

	out = fopen("anim.gif", "wb");
	if (!out) {
		fprintf(stderr, "can't create file %s", "anim.gif");
		return 1;
	}

	gdImageColorAllocate(im, 255, 255, 255); /* allocate white as side effect */
	gdImageGifAnimBegin(im, out, 1, -1);

	for(i = 0; i < 20; i++) {
		int r,g,b;
		im = gdImageCreate(100, 100);
		r = rand() % 255;
		g = rand() % 255;
		b = rand() % 255;

		gdImageColorAllocate(im, 255, 255, 255);  /* allocate white as side effect */
		black = gdImageColorAllocate(im,  r, g, b);
		printf("(%i, %i, %i)\n",r, g, b);
		gdImageFilledRectangle(im, rand() % 100, rand() % 100, rand() % 100, rand() % 100, black);
		gdImageGifAnimAdd(im, out, 1, 0, 0, 10, 1, prev);

		if(prev) {
			gdImageDestroy(prev);
		}
		prev = im;
	}

	gdImageGifAnimEnd(out);
	fclose(out);

	return 0;
}